

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall
yy::parser::basic_symbol<yy::parser::by_kind>::move
          (basic_symbol<yy::parser::by_kind> *this,basic_symbol<yy::parser::by_kind> *s)

{
  filename_type *pfVar1;
  counter_type cVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  
  (this->super_by_kind).kind_ = (s->super_by_kind).kind_;
  (s->super_by_kind).kind_ = S_YYEMPTY;
  uVar6 = (ulong)(uint)(this->super_by_kind).kind_;
  if (uVar6 < 0x2c) {
    if ((0xd61c0000000U >> (uVar6 & 0x3f) & 1) == 0) {
      if ((0x70880UL >> (uVar6 & 0x3f) & 1) == 0) {
        if (uVar6 == 0xe) {
          value_type::move<ReferenceType>(&this->value,&s->value);
        }
      }
      else {
        u = value_type::as<std::__cxx11::string>(&s->value);
        value_type::emplace<std::__cxx11::string,std::__cxx11::string>(&this->value,u);
        value_type::destroy<std::__cxx11::string>(&s->value);
      }
    }
    else {
      value_type::move<unsigned_long>(&this->value,&s->value);
    }
  }
  pfVar1 = (s->location).begin.filename;
  cVar4 = (s->location).begin.line;
  cVar5 = (s->location).begin.column;
  cVar2 = (s->location).end.line;
  cVar3 = (s->location).end.column;
  (this->location).end.filename = (s->location).end.filename;
  (this->location).end.line = cVar2;
  (this->location).end.column = cVar3;
  (this->location).begin.filename = pfVar1;
  (this->location).begin.line = cVar4;
  (this->location).begin.column = cVar5;
  return;
}

Assistant:

void
  parser::basic_symbol<Base>::move (basic_symbol& s)
  {
    super_type::move (s);
    switch (this->kind ())
    {
      case symbol_kind::S_REF_OPEN: // "reference opening"
        value.move< ReferenceType > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_arguments: // arguments
      case symbol_kind::S_argument_list: // argument_list
      case symbol_kind::S_parenthesized_arguments: // parenthesized_arguments
      case symbol_kind::S_quoted_argument: // quoted_argument
      case symbol_kind::S_quoted_element_list: // quoted_element_list
      case symbol_kind::S_unquoted_argument: // unquoted_argument
      case symbol_kind::S_reference: // reference
      case symbol_kind::S_var_reference_list: // var_reference_list
        value.move< std::size_t > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_IDENTIFIER: // "command name"
      case symbol_kind::S_BRACKET_ARGUMENT: // "bracket argument"
      case symbol_kind::S_REF_VAR_NAME: // "variable name"
      case symbol_kind::S_QUOTED_STR: // "quoted argument chars"
      case symbol_kind::S_UNQUOTED_STR: // "unquoted argument chars"
        value.move< std::string > (YY_MOVE (s.value));
        break;

      default:
        break;
    }

    location = YY_MOVE (s.location);
  }